

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O3

void __thiscall ymfm::ym2608::update_prescale(ym2608 *this,uint8_t prescale)

{
  ssg_override *psVar1;
  code *pcVar2;
  
  (this->m_fm).m_clock_prescale = prescale;
  psVar1 = (this->m_ssg).m_override;
  if (psVar1 != (ssg_override *)0x0) {
    (**(code **)(*(long *)psVar1 + 0x18))();
  }
  if (this->m_fidelity == OPN_FIDELITY_MED) {
    if (prescale == '\x02') {
      pcVar2 = ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::resample_1_n<3>;
      goto LAB_00181e10;
    }
    if (prescale == '\x03') {
      pcVar2 = ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::resample_2_3;
      goto LAB_00181e10;
    }
    pcVar2 = ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::resample_4_3;
  }
  else {
    if (this->m_fidelity == OPN_FIDELITY_MIN) {
      if (prescale == '\x02') {
        pcVar2 = ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::resample_1_n<6>;
        prescale = '\x01';
      }
      else if (prescale == '\x03') {
        pcVar2 = ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::resample_1_n<3>;
        prescale = '\0';
      }
      else {
        pcVar2 = ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::resample_2_3;
        prescale = '\x03';
      }
      goto LAB_00181e10;
    }
    if (prescale != '\x02') {
      if (prescale == '\x03') {
        pcVar2 = ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::resample_n_1<2>;
        prescale = '\t';
      }
      else {
        pcVar2 = ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::resample_n_1<4>;
        prescale = '\x12';
      }
      goto LAB_00181e10;
    }
    pcVar2 = ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::resample_n_1<1>;
  }
  prescale = '\x06';
LAB_00181e10:
  this->m_fm_samples_per_output = prescale;
  (this->m_ssg_resampler).m_resampler = (resample_func)pcVar2;
  *(undefined8 *)&(this->m_ssg_resampler).field_0x18 = 0;
  if ((this->m_ssg).m_override != (ssg_override *)0x0) {
    (this->m_ssg_resampler).m_resampler =
         (resample_func)ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::resample_nop;
    *(undefined8 *)&(this->m_ssg_resampler).field_0x18 = 0;
  }
  return;
}

Assistant:

void ym2608::update_prescale(uint8_t prescale)
{
	// tell the FM engine
	m_fm.set_clock_prescale(prescale);
	m_ssg.prescale_changed();

	// Fidelity:   ---- minimum ----    ---- medium -----    ---- maximum-----
	//              rate = clock/48      rate = clock/24      rate = clock/8
	// Prescale    FM rate  SSG rate    FM rate  SSG rate    FM rate  SSG rate
	//     6          3:1     2:3          6:1     4:3         18:1     4:1
	//     3        1.5:1     1:3          3:1     2:3          9:1     2:1
	//     2          1:1     1:6          2:1     1:3          6:1     1:1

	// compute the number of FM samples per output sample, and select the
	// resampler function
	if (m_fidelity == OPN_FIDELITY_MIN)
	{
		switch (prescale)
		{
			default:
			case 6:	m_fm_samples_per_output = 3;	m_ssg_resampler.configure(2, 3);	break;
			case 3: m_fm_samples_per_output = 0;	m_ssg_resampler.configure(1, 3);	break;
			case 2: m_fm_samples_per_output = 1;	m_ssg_resampler.configure(1, 6);	break;
		}
	}
	else if (m_fidelity == OPN_FIDELITY_MED)
	{
		switch (prescale)
		{
			default:
			case 6:	m_fm_samples_per_output = 6;	m_ssg_resampler.configure(4, 3);	break;
			case 3: m_fm_samples_per_output = 3;	m_ssg_resampler.configure(2, 3);	break;
			case 2: m_fm_samples_per_output = 2;	m_ssg_resampler.configure(1, 3);	break;
		}
	}
	else
	{
		switch (prescale)
		{
			default:
			case 6:	m_fm_samples_per_output = 18;	m_ssg_resampler.configure(4, 1);	break;
			case 3: m_fm_samples_per_output = 9;	m_ssg_resampler.configure(2, 1);	break;
			case 2: m_fm_samples_per_output = 6;	m_ssg_resampler.configure(1, 1);	break;
		}
	}

	// if overriding the SSG, override the configuration with the nop
	// resampler to at least keep the sample index moving forward
	if (m_ssg.overridden())
		m_ssg_resampler.configure(0, 0);
}